

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O0

void __thiscall
cfdcapi_script_TapscriptTreeAddTree2_Test::TestBody(cfdcapi_script_TapscriptTreeAddTree2_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  char *str_buffer;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  char *tree_str;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  uint32_t branch_count;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  void *tree_handle2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  void *tree_handle1;
  int tmp_ret;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffb58;
  AssertionResult *in_stack_fffffffffffffb60;
  CfdErrorCode *in_stack_fffffffffffffb68;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  void **in_stack_fffffffffffffb78;
  void *in_stack_fffffffffffffb98;
  char **in_stack_fffffffffffffbf0;
  AssertionResult *in_stack_fffffffffffffbf8;
  AssertionResult *in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  void *in_stack_fffffffffffffc20;
  void *in_stack_fffffffffffffc28;
  AssertionResult *pAVar5;
  void **in_stack_fffffffffffffc40;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  char *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffce8;
  AssertHelper in_stack_fffffffffffffcf0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcf8;
  AssertionResult local_2f8;
  AssertHelper local_2e8;
  Message local_2e0 [2];
  uint8_t in_stack_fffffffffffffd37;
  AssertHelper in_stack_fffffffffffffd38;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  AssertionResult local_2b0;
  char *local_2a0;
  AssertHelper local_298;
  uint8_t in_stack_fffffffffffffd77;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  void *in_stack_fffffffffffffd80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd88;
  AssertHelper local_270;
  Message local_268;
  undefined4 local_25c;
  AssertionResult local_258;
  AssertHelper local_248;
  Message local_240;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  undefined4 local_214;
  AssertionResult local_210;
  char *local_200;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined4 local_1e4;
  AssertionResult local_1e0;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined4 local_1bc;
  AssertionResult local_1b8;
  undefined4 local_1a4;
  AssertHelper local_1a0;
  Message local_198;
  undefined4 local_18c;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  undefined4 local_164;
  AssertionResult local_160;
  AssertHelper local_150;
  Message local_148;
  undefined4 local_13c;
  AssertionResult local_138;
  undefined8 local_128;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  AssertionResult local_108;
  AssertHelper local_f8;
  Message local_f0;
  undefined4 local_e4;
  AssertionResult local_e0;
  AssertHelper local_d0;
  Message local_c8;
  undefined4 local_bc;
  AssertionResult local_b8;
  undefined8 local_a8;
  int local_9c;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffb78);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffb78,
             (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             in_stack_fffffffffffffb68,(int *)in_stack_fffffffffffffb60);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!(bool)uVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3afa6a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x273,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3afacd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3afb22);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,(type *)0x3afb56);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x274,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3afc52);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3afccd);
  local_9c = 0;
  local_a8 = 0;
  local_14 = CfdInitializeTaprootScriptTree
                       ((void *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                        in_stack_fffffffffffffc40);
  local_bc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffb78,
             (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             in_stack_fffffffffffffb68,(int *)in_stack_fffffffffffffb60);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar2) {
    testing::Message::Message(&local_c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3afdad);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x279,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message((Message *)0x3afe10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3afe68);
  if (local_14 == 0) {
    local_14 = CfdSetInitialTapLeaf
                         ((void *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                          in_stack_fffffffffffffd40.ptr_,(char *)in_stack_fffffffffffffd38.data_,
                          in_stack_fffffffffffffd37);
    local_e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb78,
               (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               in_stack_fffffffffffffb68,(int *)in_stack_fffffffffffffb60);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
    if (!bVar2) {
      testing::Message::Message(&local_f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3aff4b);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x27e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message((Message *)0x3affae);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b0006);
    local_14 = CfdAddTapBranchByTapLeaf
                         (in_stack_fffffffffffffd88.ptr_,in_stack_fffffffffffffd80,
                          (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                          in_stack_fffffffffffffd77);
    local_10c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb78,
               (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               in_stack_fffffffffffffb68,(int *)in_stack_fffffffffffffb60);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_108);
    if (!bVar2) {
      testing::Message::Message(&local_118);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b00db);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x283,pcVar3);
      testing::internal::AssertHelper::operator=(&local_120,&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      testing::Message::~Message((Message *)0x3b013e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b0196);
    local_128 = 0;
    local_14 = CfdInitializeTaprootScriptTree
                         ((void *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                          in_stack_fffffffffffffc40);
    local_13c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb78,
               (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               in_stack_fffffffffffffb68,(int *)in_stack_fffffffffffffb60);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar2) {
      testing::Message::Message(&local_148);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b026b);
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x287,pcVar3);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      testing::Message::~Message((Message *)0x3b02ce);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b0326);
    if (local_14 == 0) {
      local_14 = CfdSetInitialTapLeaf
                           ((void *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                            in_stack_fffffffffffffd40.ptr_,(char *)in_stack_fffffffffffffd38.data_,
                            in_stack_fffffffffffffd37);
      local_164 = 0;
      pAVar4 = &local_160;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffffb78,
                 (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68,(int *)in_stack_fffffffffffffb60);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
      if (!bVar2) {
        testing::Message::Message(&local_170);
        in_stack_fffffffffffffc50 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3b0409);
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x28c,in_stack_fffffffffffffc50);
        testing::internal::AssertHelper::operator=(&local_178,&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        testing::Message::~Message((Message *)0x3b046c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b04c4);
      local_14 = CfdAddTapBranchByScriptTree
                           (in_stack_fffffffffffffcf8.ptr_,in_stack_fffffffffffffcf0.data_,
                            (void *)CONCAT17(uVar1,in_stack_fffffffffffffce8));
      local_18c = 0;
      pAVar5 = &local_188;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffffb78,
                 (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68,(int *)in_stack_fffffffffffffb60);
      uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
      if (!(bool)uVar1) {
        testing::Message::Message(&local_198);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b0595);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x28f,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
        testing::internal::AssertHelper::~AssertHelper(&local_1a0);
        testing::Message::~Message((Message *)0x3b05f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b0650);
      local_1a4 = 0;
      local_14 = CfdGetTapBranchCount
                           (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                            (uint32_t *)
                            CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
      local_1bc = 0;
      pAVar5 = &local_1b8;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffffb78,
                 (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68,(int *)in_stack_fffffffffffffb60);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
      if (!bVar2) {
        testing::Message::Message(&local_1c8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b072c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x293,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        testing::Message::~Message((Message *)0x3b078f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b07e4);
      local_1e4 = 1;
      in_stack_fffffffffffffc10 = &local_1e0;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffffb78,
                 (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68,(uint *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffc1f =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffc10);
      if (!(bool)in_stack_fffffffffffffc1f) {
        testing::Message::Message(&local_1f0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b0891);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x294,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
        testing::internal::AssertHelper::~AssertHelper(&local_1f8);
        testing::Message::~Message((Message *)0x3b08f4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b094c);
      local_200 = (char *)0x0;
      local_14 = CfdGetTaprootScriptTreeSrting
                           (pAVar4,in_stack_fffffffffffffc50,
                            (char **)CONCAT17(uVar1,in_stack_fffffffffffffc48));
      local_214 = 0;
      in_stack_fffffffffffffbf8 = &local_210;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffffb78,
                 (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68,(int *)in_stack_fffffffffffffb60);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffbf8);
      if (!bVar2) {
        testing::Message::Message(&local_220);
        in_stack_fffffffffffffbf0 =
             (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3b0a29);
        testing::internal::AssertHelper::AssertHelper
                  (&local_228,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x298,(char *)in_stack_fffffffffffffbf0);
        testing::internal::AssertHelper::operator=(&local_228,&local_220);
        testing::internal::AssertHelper::~AssertHelper(&local_228);
        testing::Message::~Message((Message *)0x3b0a8c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b0ae1);
      if (local_14 == 0) {
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_238,
                   "\"{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}\""
                   ,"tree_str",
                   "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}"
                   ,local_200);
        bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_238);
        if (!bVar2) {
          testing::Message::Message(&local_240);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b0b90);
          testing::internal::AssertHelper::AssertHelper
                    (&local_248,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                     ,0x29c,pcVar3);
          testing::internal::AssertHelper::operator=(&local_248,&local_240);
          testing::internal::AssertHelper::~AssertHelper(&local_248);
          testing::Message::~Message((Message *)0x3b0bf3);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b0c48);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffffb68);
        local_200 = (char *)0x0;
      }
      local_9c = CfdFreeTaprootScriptTreeHandle
                           ((void *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                            in_stack_fffffffffffffc10);
      local_25c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffffb78,
                 (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68,(int *)in_stack_fffffffffffffb60);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_258);
      if (!bVar2) {
        testing::Message::Message(&local_268);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b0d20);
        testing::internal::AssertHelper::AssertHelper
                  (&local_270,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x2a2,pcVar3);
        testing::internal::AssertHelper::operator=(&local_270,&local_268);
        testing::internal::AssertHelper::~AssertHelper(&local_270);
        testing::Message::~Message((Message *)0x3b0d7d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b0dd2);
    }
    local_9c = CfdFreeTaprootScriptTreeHandle
                         ((void *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                          in_stack_fffffffffffffc10);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb78,
               (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               in_stack_fffffffffffffb68,(int *)in_stack_fffffffffffffb60);
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd80);
    if (!bVar2) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd70);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b0e91);
      testing::internal::AssertHelper::AssertHelper
                (&local_298,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x2a6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_298,(Message *)&stack0xfffffffffffffd70);
      testing::internal::AssertHelper::~AssertHelper(&local_298);
      testing::Message::~Message((Message *)0x3b0eee);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b0f43);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffb98);
  if (local_14 != 0) {
    local_2a0 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    pAVar4 = &local_2b0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb78,
               (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               in_stack_fffffffffffffb68,(int *)in_stack_fffffffffffffb60);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar2) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd40);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b1030);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x2ad,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd38,(Message *)&stack0xfffffffffffffd40);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd38);
      testing::Message::~Message((Message *)0x3b108d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b10e2);
    testing::internal::CmpHelperSTREQ((internal *)(local_2e0 + 1),"\"\"","str_buffer","",local_2a0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_2e0 + 1));
    if (!bVar2) {
      testing::Message::Message(local_2e0);
      in_stack_fffffffffffffb78 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x3b1177);
      testing::internal::AssertHelper::AssertHelper
                (&local_2e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x2ae,(char *)in_stack_fffffffffffffb78);
      testing::internal::AssertHelper::operator=(&local_2e8,local_2e0);
      testing::internal::AssertHelper::~AssertHelper(&local_2e8);
      testing::Message::~Message((Message *)0x3b11d4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b1229);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffb68);
    local_2a0 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffb68);
  pAVar4 = &local_2f8;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffb78,
             (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             (CfdErrorCode *)pAVar4,(int *)in_stack_fffffffffffffb60);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar2) {
    testing::Message::Message((Message *)&stack0xfffffffffffffcf8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b12f9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffcf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x2b4,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffcf0,(Message *)&stack0xfffffffffffffcf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffcf0);
    testing::Message::~Message((Message *)0x3b1356);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b13ab);
  return;
}

Assistant:

TEST(cfdcapi_script, TapscriptTreeAddTree2) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int tmp_ret = 0;
  void* tree_handle1 = nullptr;
  ret = CfdInitializeTaprootScriptTree(handle, &tree_handle1);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdSetInitialTapLeaf(handle, tree_handle1,
        "20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac",
        0xc0);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTapBranchByTapLeaf(handle, tree_handle1,
        "51",
        0xc0);
    EXPECT_EQ(kCfdSuccess, ret);

    void* tree_handle2 = nullptr;
    ret = CfdInitializeTaprootScriptTree(handle, &tree_handle2);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      ret = CfdSetInitialTapLeaf(handle, tree_handle2,
          "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac",
          0xc0);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdAddTapBranchByScriptTree(handle, tree_handle2, tree_handle1);
      EXPECT_EQ(kCfdSuccess, ret);

      uint32_t branch_count = 0;
      ret = CfdGetTapBranchCount(handle, tree_handle2, &branch_count);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(1, branch_count);

      char* tree_str = nullptr;
      ret = CfdGetTaprootScriptTreeSrting(handle, tree_handle2, &tree_str);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ(
          "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}",
          tree_str);
        CfdFreeStringBuffer(tree_str);
        tree_str = nullptr;
      }

      tmp_ret = CfdFreeTaprootScriptTreeHandle(handle, tree_handle2);
      EXPECT_EQ(kCfdSuccess, tmp_ret);
    }

    tmp_ret = CfdFreeTaprootScriptTreeHandle(handle, tree_handle1);
    EXPECT_EQ(kCfdSuccess, tmp_ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}